

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::FixedDecimalColumnWriter::WriteVector
          (FixedDecimalColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *page_state,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  bool bVar1;
  idx_t r;
  hugeint_t *val;
  hugeint_t input;
  data_t temp_buffer [16];
  
  FlatVector::VerifyFlatVector(input_column);
  val = (hugeint_t *)(input_column->data + chunk_start * 0x10);
  for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(input_column->validity).super_TemplatedValidityMask<unsigned_long>,
                       chunk_start);
    if (bVar1) {
      FixedDecimalStatistics::Update((FixedDecimalStatistics *)stats_p,val);
      input.upper = (int64_t)temp_buffer;
      input.lower = val->upper;
      WriteParquetDecimal((duckdb *)val->lower,input,(data_ptr_t)page_state);
      (**temp_writer->_vptr_WriteStream)(temp_writer,temp_buffer,0x10);
    }
    val = val + 1;
  }
  return;
}

Assistant:

void FixedDecimalColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                           ColumnWriterPageState *page_state, Vector &input_column, idx_t chunk_start,
                                           idx_t chunk_end) {
	auto &mask = FlatVector::Validity(input_column);
	auto *ptr = FlatVector::GetData<hugeint_t>(input_column);
	auto &stats = stats_p->Cast<FixedDecimalStatistics>();

	data_t temp_buffer[16];
	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (mask.RowIsValid(r)) {
			stats.Update(ptr[r]);
			WriteParquetDecimal(ptr[r], temp_buffer);
			temp_writer.WriteData(temp_buffer, 16);
		}
	}
}